

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BigUnsigned<4> *this)

{
  int iVar1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  uint32_t next_digit;
  undefined1 local_2c [8];
  BigUnsigned<4> copy;
  BigUnsigned<4> *this_local;
  string *result;
  
  local_2c._0_4_ = this->size_;
  local_2c._4_4_ = this->words_[0];
  copy.size_ = this->words_[1];
  copy.words_[0] = this->words_[2];
  copy.words_[1] = this->words_[3];
  copy.words_._8_8_ = this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    iVar1 = size((BigUnsigned<4> *)local_2c);
    if (iVar1 < 1) break;
    DivMod<10u>((BigUnsigned<4> *)local_2c);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
  return __return_storage_ptr__;
}

Assistant:

std::string BigUnsigned<max_words>::ToString() const {
  BigUnsigned<max_words> copy = *this;
  std::string result;
  // Build result in reverse order
  while (copy.size() > 0) {
    uint32_t next_digit = copy.DivMod<10>();
    result.push_back('0' + static_cast<char>(next_digit));
  }
  if (result.empty()) {
    result.push_back('0');
  }
  std::reverse(result.begin(), result.end());
  return result;
}